

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkDirectoriesCommand.cxx
# Opt level: O0

void __thiscall cmLinkDirectoriesCommand::AddLinkDir(cmLinkDirectoriesCommand *this,string *dir)

{
  cmMakefile *pcVar1;
  bool bVar2;
  PolicyStatus PVar3;
  char *pcVar4;
  ostream *poVar5;
  PolicyID id;
  allocator local_289;
  string local_288;
  allocator local_261;
  string local_260 [8];
  string tmp;
  string local_220;
  string local_200;
  string local_1e0;
  undefined1 local_1c0 [8];
  ostringstream e;
  bool convertToAbsolute;
  undefined1 local_38 [8];
  string unixPath;
  string *dir_local;
  cmLinkDirectoriesCommand *this_local;
  
  unixPath.field_2._8_8_ = dir;
  std::__cxx11::string::string((string *)local_38,(string *)dir);
  cmsys::SystemTools::ConvertToUnixSlashes((string *)local_38);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  bVar2 = cmsys::SystemTools::FileIsFullPath(pcVar4);
  if (!bVar2) {
    bVar2 = false;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    poVar5 = std::operator<<((ostream *)local_1c0,"This command specifies the relative path\n");
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = std::operator<<(poVar5,(string *)local_38);
    poVar5 = std::operator<<(poVar5,"\n");
    std::operator<<(poVar5,"as a link directory.\n");
    PVar3 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0015);
    switch(PVar3) {
    case WARN:
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1e0,(cmPolicies *)0xf,id);
      std::operator<<((ostream *)local_1c0,(string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_200,false);
      std::__cxx11::string::~string((string *)&local_200);
    case OLD:
      break;
    case REQUIRED_IF_USED:
    case REQUIRED_ALWAYS:
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_220,(cmPolicies *)0xf,id);
      std::operator<<((ostream *)local_1c0,(string *)&local_220);
      std::__cxx11::string::~string((string *)&local_220);
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)((long)&tmp.field_2 + 8),false);
      std::__cxx11::string::~string((string *)(tmp.field_2._M_local_buf + 8));
    case NEW:
      bVar2 = true;
    }
    if (bVar2) {
      pcVar4 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_260,pcVar4,&local_261);
      std::allocator<char>::~allocator((allocator<char> *)&local_261);
      std::__cxx11::string::operator+=(local_260,"/");
      std::__cxx11::string::operator+=(local_260,(string *)local_38);
      std::__cxx11::string::operator=((string *)local_38,local_260);
      std::__cxx11::string::~string(local_260);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  }
  pcVar1 = (this->super_cmCommand).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_288,"LINK_DIRECTORIES",&local_289);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmMakefile::AppendProperty(pcVar1,&local_288,pcVar4,false);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmLinkDirectoriesCommand::AddLinkDir(std::string const& dir)
{
  std::string unixPath = dir;
  cmSystemTools::ConvertToUnixSlashes(unixPath);
  if(!cmSystemTools::FileIsFullPath(unixPath.c_str()))
    {
    bool convertToAbsolute = false;
    std::ostringstream e;
    e << "This command specifies the relative path\n"
      << "  " << unixPath << "\n"
      << "as a link directory.\n";
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0015))
      {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0015);
        this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, e.str());
      case cmPolicies::OLD:
        // OLD behavior does not convert
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        e << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0015);
        this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
      case cmPolicies::NEW:
        // NEW behavior converts
        convertToAbsolute = true;
        break;
      }
    if (convertToAbsolute)
      {
      std::string tmp = this->Makefile->GetCurrentSourceDirectory();
      tmp += "/";
      tmp += unixPath;
      unixPath = tmp;
      }
    }
  this->Makefile->AppendProperty("LINK_DIRECTORIES", unixPath.c_str());
}